

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O0

ED * __thiscall ED::drawParticularSegments(ED *this,vector<int,_std::allocator<int>_> *list)

{
  bool bVar1;
  int iVar2;
  reference piVar3;
  reference pvVar4;
  reference pt;
  uchar *puVar5;
  vector<int,_std::allocator<int>_> *in_RDX;
  Point_<int> local_88;
  __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  local_80;
  Point_<int> *local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  int *local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  iterator itInt;
  iterator it;
  MatSize local_2c [11];
  undefined1 local_21;
  vector<int,_std::allocator<int>_> *list_local;
  ED *this_local;
  Mat *segmentsImage;
  
  local_21 = 0;
  list_local = list;
  this_local = this;
  cv::MatSize::operator()(local_2c);
  iVar2 = cv::Mat::type((Mat *)&list[0xd].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&it,0.0);
  cv::Mat::Mat((Mat *)this,local_2c,iVar2,&it);
  __gnu_cxx::
  __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  ::__normal_iterator((__normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                       *)&itInt);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
            (&local_60);
  local_68 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_RDX);
  local_60._M_current = local_68;
  while( true ) {
    local_70._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(in_RDX);
    bVar1 = __gnu_cxx::operator!=(&local_60,&local_70);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_60);
    pvVar4 = std::
             vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           *)&(list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_end_of_storage,(long)*piVar3);
    local_78 = (Point_<int> *)
               std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::begin(pvVar4);
    itInt._M_current = (int *)local_78;
    while( true ) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_60);
      pvVar4 = std::
               vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                             *)&(list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)*piVar3);
      local_80._M_current =
           (Point_<int> *)
           std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::end(pvVar4);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                          *)&itInt,&local_80);
      if (!bVar1) break;
      pt = __gnu_cxx::
           __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
           ::operator*((__normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                        *)&itInt);
      cv::Point_<int>::Point_(&local_88,pt);
      puVar5 = cv::Mat::at<unsigned_char>((Mat *)this,&local_88);
      *puVar5 = 0xff;
      __gnu_cxx::
      __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
      ::operator++((__normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                    *)&itInt,0);
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_60,0);
  }
  return this;
}

Assistant:

Mat ED::drawParticularSegments(std::vector<int> list)
{
	Mat segmentsImage = Mat(edgeImage.size(), edgeImage.type(), Scalar(0));

	std::vector<Point>::iterator it;
	std::vector<int>::iterator itInt;

	for (itInt = list.begin(); itInt != list.end(); itInt++)
		for (it = segmentPoints[*itInt].begin(); it != segmentPoints[*itInt].end(); it++)
			segmentsImage.at<uchar>(*it) = 255;
	
	return segmentsImage;
}